

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::EnforceUniqueName(cmMakefile *this,string *name,string *msg,bool isCustom)

{
  TargetType TVar1;
  cmState *this_00;
  bool bVar2;
  byte bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  cmTarget *pcVar6;
  string *psVar7;
  PolicyID id;
  byte unaff_R13B;
  string asStack_1c8 [32];
  ostringstream e;
  
  bVar2 = IsAlias(this,name);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar5 = std::operator<<((ostream *)&e,"cannot create target \"");
    poVar5 = std::operator<<(poVar5,(string *)name);
    std::operator<<(poVar5,"\" because an alias with the same name already exists.");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)msg,asStack_1c8);
    std::__cxx11::string::~string(asStack_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar3 = 0;
    goto LAB_001724aa;
  }
  pcVar6 = FindTargetToUse(this,name,false);
  if (pcVar6 != (cmTarget *)0x0) {
    if (pcVar6->IsImportedTarget == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,"cannot create target \"");
      poVar5 = std::operator<<(poVar5,(string *)name);
      std::operator<<(poVar5,"\" because an imported target with the same name already exists.");
      std::__cxx11::stringbuf::str();
LAB_0017240c:
      std::__cxx11::string::operator=((string *)msg,asStack_1c8);
      std::__cxx11::string::~string(asStack_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      unaff_R13B = 0;
    }
    else {
      PVar4 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0002,false);
      unaff_R13B = 1;
      if (PVar4 - REQUIRED_IF_USED < 2) {
        cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&e,(cmPolicies *)0x2,id);
        IssueMessage(this,FATAL_ERROR,(string *)&e);
      }
      else {
        if (PVar4 == OLD) goto LAB_001724a1;
        if (PVar4 != WARN) {
          if (((isCustom) && (pcVar6->TargetTypeValue == UTILITY)) && (pcVar6->Makefile != this)) {
            this_00 = this->GlobalGenerator->CMakeInstance->State;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,"ALLOW_DUPLICATE_CUSTOM_TARGETS",(allocator<char> *)asStack_1c8)
            ;
            bVar2 = cmState::GetGlobalPropertyAsBool(this_00,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
            if (bVar2) goto LAB_001724a1;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,"cannot create target \"");
          poVar5 = std::operator<<(poVar5,(string *)name);
          poVar5 = std::operator<<(poVar5,
                                   "\" because another target with the same name already exists.  ")
          ;
          std::operator<<(poVar5,"The existing target is ");
          TVar1 = pcVar6->TargetTypeValue;
          if (((ulong)TVar1 < 8) && ((0xafU >> (TVar1 & 0x1f) & 1) != 0)) {
            std::operator<<((ostream *)&e,&DAT_003ef9e4 + *(int *)(&DAT_003ef9e4 + (ulong)TVar1 * 4)
                           );
          }
          poVar5 = std::operator<<((ostream *)&e,"created in source directory \"");
          psVar7 = GetCurrentSourceDirectory_abi_cxx11_(pcVar6->Makefile);
          poVar5 = std::operator<<(poVar5,(string *)psVar7);
          poVar5 = std::operator<<(poVar5,"\".  ");
          std::operator<<(poVar5,"See documentation for policy CMP0002 for more details.");
          std::__cxx11::stringbuf::str();
          goto LAB_0017240c;
        }
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&e,(cmPolicies *)0x2,id);
        IssueMessage(this,AUTHOR_WARNING,(string *)&e);
      }
      std::__cxx11::string::~string((string *)&e);
    }
  }
LAB_001724a1:
  bVar3 = pcVar6 == (cmTarget *)0x0 | unaff_R13B;
LAB_001724aa:
  return (bool)(bVar3 & 1);
}

Assistant:

bool cmMakefile::EnforceUniqueName(std::string const& name, std::string& msg,
                                   bool isCustom) const
{
  if (this->IsAlias(name)) {
    std::ostringstream e;
    e << "cannot create target \"" << name
      << "\" because an alias with the same name already exists.";
    msg = e.str();
    return false;
  }
  if (cmTarget* existing = this->FindTargetToUse(name)) {
    // The name given conflicts with an existing target.  Produce an
    // error in a compatible way.
    if (existing->IsImported()) {
      // Imported targets were not supported in previous versions.
      // This is new code, so we can make it an error.
      std::ostringstream e;
      e << "cannot create target \"" << name
        << "\" because an imported target with the same name already exists.";
      msg = e.str();
      return false;
    }
    // target names must be globally unique
    switch (this->GetPolicyStatus(cmPolicies::CMP0002)) {
      case cmPolicies::WARN:
        this->IssueMessage(MessageType::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0002));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return true;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0002));
        return true;
      case cmPolicies::NEW:
        break;
    }

    // The conflict is with a non-imported target.
    // Allow this if the user has requested support.
    cmake* cm = this->GetCMakeInstance();
    if (isCustom && existing->GetType() == cmStateEnums::UTILITY &&
        this != existing->GetMakefile() &&
        cm->GetState()->GetGlobalPropertyAsBool(
          "ALLOW_DUPLICATE_CUSTOM_TARGETS")) {
      return true;
    }

    // Produce an error that tells the user how to work around the
    // problem.
    std::ostringstream e;
    e << "cannot create target \"" << name
      << "\" because another target with the same name already exists.  "
      << "The existing target is ";
    switch (existing->GetType()) {
      case cmStateEnums::EXECUTABLE:
        e << "an executable ";
        break;
      case cmStateEnums::STATIC_LIBRARY:
        e << "a static library ";
        break;
      case cmStateEnums::SHARED_LIBRARY:
        e << "a shared library ";
        break;
      case cmStateEnums::MODULE_LIBRARY:
        e << "a module library ";
        break;
      case cmStateEnums::UTILITY:
        e << "a custom target ";
        break;
      case cmStateEnums::INTERFACE_LIBRARY:
        e << "an interface library ";
        break;
      default:
        break;
    }
    e << "created in source directory \""
      << existing->GetMakefile()->GetCurrentSourceDirectory() << "\".  "
      << "See documentation for policy CMP0002 for more details.";
    msg = e.str();
    return false;
  }
  return true;
}